

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  _Base_ptr p_Var1;
  bool bVar2;
  Column_zp_settings *this;
  _Rb_tree_node_base *p_Var3;
  undefined1 *puVar4;
  _List_node_base *p_Var5;
  undefined4 local_4b4;
  undefined4 *local_4b0;
  _Base_ptr local_4a8;
  undefined **local_4a0;
  ulong local_498;
  shared_count sStack_490;
  undefined4 **local_488;
  undefined8 local_480;
  uint local_478 [2];
  undefined8 *local_470;
  _Base_ptr *local_468;
  undefined1 local_460 [8];
  undefined8 local_458;
  shared_count sStack_450;
  char *local_448;
  char *local_440;
  undefined **local_438;
  char *local_430;
  undefined8 *local_428;
  char *local_420;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_3e8;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  m.colSettings_ = this;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
  ::
  Chain_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
              *)&m.matrix_,&local_3e8,this);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       local_3e8.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_3e8.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bars1._M_t._M_impl._0_8_ =
       local_3e8.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3e8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_3e8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bars2._M_t._M_impl._0_8_;
  local_3e8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&local_3e8,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((Chain_pairing_option *)
      m.matrix_.super_Chain_pairing_option.barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != &m.matrix_.super_Chain_pairing_option) {
    p_Var5 = m.matrix_.super_Chain_pairing_option.barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var5 + 1;
      __args_1 = (uint *)((long)&p_Var5[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
      local_478[0] = *(uint *)&p_Var5[1]._M_prev;
      local_480 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_480,(uint *)((long)&local_480 + 4),local_478);
      p_Var5 = p_Var5->_M_next;
    } while ((Chain_pairing_option *)p_Var5 != &m.matrix_.super_Chain_pairing_option);
  }
  p_Var1 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x574);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4a8 = (_Base_ptr)&p_Var1[1]._M_parent;
  local_4b0 = &local_4b4;
  local_4b4 = 0;
  local_460[0] = *(int *)&p_Var1[1]._M_parent == 0;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_468 = &local_4a8;
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_498 = local_498 & 0xffffffffffffff00;
  local_488 = &local_4b0;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x575);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 0;
  local_460[0] = *(int *)&p_Var1[1].field_0x4 == 0;
  local_4a8 = (_Base_ptr)&p_Var1[1].field_0x4;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x577);
  local_4a8 = p_Var1 + 1;
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 0xffffffff;
  local_460[0] = local_4a8->_M_color == ~_S_red;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x579);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 0;
  local_460[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_4a8 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x57a);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 1;
  local_460[0] = *(int *)&p_Var3[1].field_0x4 == 1;
  local_4a8 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x57b);
  local_4a8 = p_Var3 + 1;
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 3;
  local_460[0] = local_4a8->_M_color == 3;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x57d);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 0;
  local_460[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_4a8 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x57e);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 2;
  local_460[0] = *(int *)&p_Var3[1].field_0x4 == 2;
  local_4a8 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x57f);
  local_4a8 = p_Var3 + 1;
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 4;
  local_460[0] = local_4a8->_M_color == 4;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x581);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 0;
  local_460[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_4a8 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x582);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 7;
  local_460[0] = *(int *)&p_Var3[1].field_0x4 == 7;
  local_4a8 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x583);
  local_4a8 = p_Var3 + 1;
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 8;
  local_460[0] = local_4a8->_M_color == 8;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x585);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 1;
  local_460[0] = *(int *)&p_Var3[1]._M_parent == 1;
  local_4a8 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x586);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 5;
  local_460[0] = *(int *)&p_Var3[1].field_0x4 == 5;
  local_4a8 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x587);
  local_4a8 = p_Var3 + 1;
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_438 = &PTR__lazy_ostream_00242048;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_420 = "";
  local_4b4 = 6;
  local_460[0] = local_4a8->_M_color == 6;
  local_458 = 0;
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242008;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = &local_4a8;
  local_4b0 = &local_4b4;
  local_498 = local_498 & 0xffffffffffffff00;
  local_4a0 = &PTR__lazy_ostream_00242008;
  sStack_490.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            (local_460,&local_438,&local_448,0x587,1,2,2,"std::get<2>(*it)",&local_480,"6",
             &local_4a0);
  boost::detail::shared_count::~shared_count(&sStack_450);
  puVar4 = (undefined1 *)std::_Rb_tree_increment(p_Var3);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x589);
  local_4a0 = (undefined **)
              CONCAT71(local_4a0._1_7_,
                       (_Rb_tree_header *)puVar4 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_438 = (undefined **)0x2032c3;
  local_430 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242248;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_468 = (_Base_ptr *)&local_438;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  local_4a0 = (undefined **)CONCAT71(local_4a0._1_7_,bVar2);
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_438 = (undefined **)0x2032d5;
  local_430 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242248;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_468 = (_Base_ptr *)&local_438;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  local_4a0 = (undefined **)CONCAT71(local_4a0._1_7_,bVar2);
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_438 = (undefined **)0x2032e4;
  local_430 = "";
  local_478[0] = local_478[0] & 0xffffff00;
  local_480 = &PTR__lazy_ostream_00242248;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = (_Base_ptr *)&local_438;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_3e8);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}